

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_ParseWithOpts(char *value,char **return_parse_end,cJSON_bool require_null_terminated)

{
  long lVar1;
  cJSON_bool cVar2;
  size_t sVar3;
  cJSON *item;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  parse_buffer local_68;
  
  local_68.depth = 0;
  global_error_0 = (char *)0x0;
  global_error_1 = 0;
  if (value == (char *)0x0) {
    global_error_0 = (char *)0x0;
    global_error_1 = 0;
    return (cJSON *)0x0;
  }
  local_68.content = (uchar *)value;
  sVar3 = strlen(value);
  sVar6 = sVar3 + 1;
  local_68.offset = 0;
  local_68.hooks.allocate._0_4_ = global_hooks.allocate._0_4_;
  local_68.hooks.allocate._4_4_ = global_hooks.allocate._4_4_;
  local_68.hooks.deallocate._0_4_ = global_hooks.deallocate._0_4_;
  local_68.hooks.deallocate._4_4_ = global_hooks.deallocate._4_4_;
  local_68.hooks.reallocate = global_hooks.reallocate;
  local_68.length = sVar6;
  item = (cJSON *)(*(code *)CONCAT44(global_hooks.allocate._4_4_,global_hooks.allocate._0_4_))(0x40)
  ;
  if (item == (cJSON *)0x0) {
    local_68.offset = 0;
    goto LAB_00101660;
  }
  item->valuedouble = 0.0;
  item->string = (char *)0x0;
  item->valuestring = (char *)0x0;
  *(undefined8 *)&item->valueint = 0;
  item->child = (cJSON *)0x0;
  *(undefined8 *)&item->type = 0;
  item->next = (cJSON *)0x0;
  item->prev = (cJSON *)0x0;
  if (sVar6 == 0) {
    sVar4 = 0;
  }
  else if ((byte)*value < 0x21) {
    sVar5 = 0;
    do {
      sVar4 = sVar5 + 1;
      if (sVar3 == sVar5) goto LAB_001015f1;
      lVar1 = sVar5 + 1;
      sVar5 = sVar4;
      local_68.offset = sVar4;
    } while ((byte)value[lVar1] < 0x21);
  }
  else {
    sVar4 = 0;
  }
  if (sVar4 != sVar6) {
    sVar3 = local_68.offset;
  }
LAB_001015f1:
  local_68.offset = sVar3;
  cVar2 = parse_value(item,&local_68);
  if (cVar2 != 0) {
    if (require_null_terminated == 0) goto LAB_001016a3;
    if (local_68.content != (uchar *)0x0) {
      if (local_68.offset < local_68.length) {
        do {
          if (0x20 < local_68.content[local_68.offset]) goto LAB_00101635;
          local_68.offset = local_68.offset + 1;
        } while (local_68.length != local_68.offset);
      }
      else {
LAB_00101635:
        if (local_68.offset != local_68.length) goto LAB_00101643;
      }
      local_68.offset = local_68.length - 1;
    }
LAB_00101643:
    if ((local_68.offset < local_68.length) && (local_68.content[local_68.offset] == '\0')) {
LAB_001016a3:
      if (return_parse_end == (char **)0x0) {
        return item;
      }
      *return_parse_end = (char *)(local_68.content + local_68.offset);
      return item;
    }
  }
  cJSON_Delete(item);
  sVar6 = local_68.length;
LAB_00101660:
  global_error_1 = 0;
  if (sVar6 != 0) {
    global_error_1 = sVar6 - 1;
  }
  if (local_68.offset < sVar6) {
    global_error_1 = local_68.offset;
  }
  if (return_parse_end != (char **)0x0) {
    *return_parse_end = value + global_error_1;
  }
  global_error_0 = value;
  return (cJSON *)0x0;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_ParseWithOpts(const char *value, const char **return_parse_end, cJSON_bool require_null_terminated)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    cJSON *item = NULL;

    /* reset error position */
    global_error.json = NULL;
    global_error.position = 0;

    if (value == NULL)
    {
        goto fail;
    }

    buffer.content = (const unsigned char*)value;
    buffer.length = strlen((const char*)value) + sizeof("");
    buffer.offset = 0;
    buffer.hooks = global_hooks;

    item = cJSON_New_Item(&global_hooks);
    if (item == NULL) /* memory fail */
    {
        goto fail;
    }

    if (!parse_value(item, buffer_skip_whitespace(&buffer)))
    {
        /* parse failure. ep is set. */
        goto fail;
    }

    /* if we require null-terminated JSON without appended garbage, skip and then check for a null terminator */
    if (require_null_terminated)
    {
        buffer_skip_whitespace(&buffer);
        if ((buffer.offset >= buffer.length) || buffer_at_offset(&buffer)[0] != '\0')
        {
            goto fail;
        }
    }
    if (return_parse_end)
    {
        *return_parse_end = (const char*)buffer_at_offset(&buffer);
    }

    return item;

fail:
    if (item != NULL)
    {
        cJSON_Delete(item);
    }

    if (value != NULL)
    {
        error local_error;
        local_error.json = (const unsigned char*)value;
        local_error.position = 0;

        if (buffer.offset < buffer.length)
        {
            local_error.position = buffer.offset;
        }
        else if (buffer.length > 0)
        {
            local_error.position = buffer.length - 1;
        }

        if (return_parse_end != NULL)
        {
            *return_parse_end = (const char*)local_error.json + local_error.position;
        }
 
        global_error = local_error;
    }

    return NULL;
}